

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calendar.cpp
# Opt level: O0

void icu_63::getCalendarKeyword(UnicodeString *id,char *targetBuffer,int32_t targetBufferSize)

{
  int8_t iVar1;
  char16_t cVar2;
  int32_t iVar3;
  int32_t iVar4;
  int local_7c;
  int32_t keywordIdx;
  int32_t keyLen;
  int32_t calKeyLen;
  ConstChar16Ptr local_68;
  undefined1 local_60 [8];
  UnicodeString calendarKeyword;
  int32_t targetBufferSize_local;
  char *targetBuffer_local;
  UnicodeString *id_local;
  
  calendarKeyword.fUnion._52_4_ = targetBufferSize;
  ConstChar16Ptr::ConstChar16Ptr(&local_68,L"calendar=");
  UnicodeString::UnicodeString((UnicodeString *)local_60,'\x01',&local_68,-1);
  ConstChar16Ptr::~ConstChar16Ptr(&local_68);
  iVar3 = UnicodeString::length((UnicodeString *)local_60);
  local_7c = 0;
  iVar4 = UnicodeString::indexOf(id,L'=');
  cVar2 = UnicodeString::operator[](id,0);
  if (cVar2 == L'@') {
    iVar1 = UnicodeString::compareBetween(id,1,iVar4 + 1,(UnicodeString *)local_60,0,iVar3);
    if (iVar1 == '\0') {
      iVar3 = UnicodeString::length(id);
      local_7c = UnicodeString::extract
                           (id,iVar4 + 1,iVar3,targetBuffer,calendarKeyword.fUnion._52_4_,kInvariant
                           );
    }
  }
  targetBuffer[local_7c] = '\0';
  UnicodeString::~UnicodeString((UnicodeString *)local_60);
  return;
}

Assistant:

static void getCalendarKeyword(const UnicodeString &id, char *targetBuffer, int32_t targetBufferSize) {
    UnicodeString calendarKeyword = UNICODE_STRING_SIMPLE("calendar=");
    int32_t calKeyLen = calendarKeyword.length();
    int32_t keyLen = 0;

    int32_t keywordIdx = id.indexOf((UChar)0x003D); /* '=' */
    if (id[0] == 0x40/*'@'*/
        && id.compareBetween(1, keywordIdx+1, calendarKeyword, 0, calKeyLen) == 0)
    {
        keyLen = id.extract(keywordIdx+1, id.length(), targetBuffer, targetBufferSize, US_INV);
    }
    targetBuffer[keyLen] = 0;
}